

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O1

int __thiscall ncnn::YoloDetectionOutput::create_pipeline(YoloDetectionOutput *this,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  ParamDict pd;
  ParamDict PStack_918;
  
  pLVar3 = create_layer(0x20);
  this->softmax = pLVar3;
  ParamDict::ParamDict(&PStack_918);
  ParamDict::set(&PStack_918,0,0);
  (*this->softmax->_vptr_Layer[2])(this->softmax,&PStack_918);
  (*this->softmax->_vptr_Layer[4])(this->softmax,opt);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&PStack_918.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&PStack_918.params[0].type + lVar4);
        plVar2 = *(long **)((long)&PStack_918.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&PStack_918.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&PStack_918.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&PStack_918.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&PStack_918.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&PStack_918.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&PStack_918.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&PStack_918.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return 0;
}

Assistant:

int YoloDetectionOutput::create_pipeline(const Option& opt)
{
    {
        softmax = ncnn::create_layer(ncnn::LayerType::Softmax);

        ncnn::ParamDict pd;
        pd.set(0, 0);// axis

        softmax->load_param(pd);

        softmax->create_pipeline(opt);
    }

    return 0;
}